

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void gl4cts::CopyImage::write3Channel<unsigned_char,3u,3u,2u,5u,2u,0u>
               (GLuint channel,GLdouble value,GLubyte *pixel)

{
  TestError *this;
  uchar t_value;
  GLdouble d_value;
  GLdouble d_max;
  uchar result;
  uchar *ptr;
  uchar off;
  uchar max;
  uchar mask;
  GLubyte *pixel_local;
  GLdouble value_local;
  GLuint channel_local;
  
  if (channel == 0) {
    ptr._7_1_ = 7;
    ptr._6_1_ = 7;
    ptr._5_1_ = 5;
  }
  else if (channel == 1) {
    ptr._7_1_ = 7;
    ptr._6_1_ = 7;
    ptr._5_1_ = 2;
  }
  else {
    if (channel != 2) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Invalid channel",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                 ,0x867);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    ptr._7_1_ = 3;
    ptr._6_1_ = 3;
    ptr._5_1_ = 0;
  }
  *pixel = *pixel | ((byte)(int)(value * (double)ptr._6_1_) & ptr._7_1_) << ptr._5_1_;
  return;
}

Assistant:

void write3Channel(GLuint channel, GLdouble value, GLubyte* pixel)
{
	T  mask   = 0;
	T  max	= 0;
	T  off	= 0;
	T* ptr	= (T*)pixel;
	T  result = 0;

	static const T max_1 = (1 << size_1) - 1;
	static const T max_2 = (1 << size_2) - 1;
	static const T max_3 = (1 << size_3) - 1;

	switch (channel)
	{
	case 0:
		mask = max_1;
		max  = max_1;
		off  = off_1;
		break;
	case 1:
		mask = max_2;
		max  = max_2;
		off  = off_2;
		break;
	case 2:
		mask = max_3;
		max  = max_3;
		off  = off_3;
		break;
	default:
		TCU_FAIL("Invalid channel");
		break;
	}

	const GLdouble d_max   = (GLdouble)max;
	const GLdouble d_value = value * d_max;
	const T		   t_value = (T)d_value;

	result = (T)((t_value & mask) << off);

	*ptr |= result;
}